

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.h
# Opt level: O2

void __thiscall
mjs::function_object::put_prototype_with_attributes
          (function_object *this,object_ptr *p,property_attribute attributes)

{
  bool bVar1;
  property_attribute a;
  value_representation local_50;
  value local_48;
  
  local_48.type_ = 9;
  local_48._4_4_ = 0;
  local_48.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x189eb4;
  a = (*(this->super_native_object).super_object._vptr_object[6])();
  bVar1 = is_valid(a);
  if (bVar1) {
    value::value(&local_48,p);
    value_representation::value_representation(&local_50,&local_48);
    (this->prototype_prop_).repr_ = local_50.repr_;
    value::~value(&local_48);
    native_object::update_property_attributes(&this->super_native_object,"prototype",attributes);
    return;
  }
  __assert_fail("is_valid(object::own_property_attributes(L\"prototype\"))",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x1d,
                "void mjs::function_object::put_prototype_with_attributes(const object_ptr &, property_attribute)"
               );
}

Assistant:

void put_prototype_with_attributes(const object_ptr& p, property_attribute attributes) {
        assert(is_valid(object::own_property_attributes(L"prototype")));
        prototype_prop_ = value_representation{value{p}};
        update_property_attributes("prototype", attributes);
    }